

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void write_character_dump(ang_file *fff)

{
  ang_file *paVar1;
  _Bool _Var2;
  char cVar3;
  uint16_t uVar4;
  wchar_t wVar5;
  int iVar6;
  store_conflict *store;
  object *p_00;
  char *pcVar7;
  object *poVar8;
  size_t sVar9;
  char *pcVar10;
  bool bVar11;
  wchar_t local_f0;
  wchar_t local_e8;
  size_t u8len;
  char *desc;
  char *title;
  wchar_t opt;
  object *obj_3;
  object *obj_2;
  object *obj_1;
  object *obj;
  char *p;
  char *buf;
  char local_88 [4];
  wchar_t n;
  char o_name [80];
  object **home_list;
  store *home;
  wchar_t c;
  wchar_t a;
  wchar_t ylim;
  wchar_t y;
  wchar_t x;
  wchar_t i;
  ang_file *fff_local;
  
  store = stores + (int)(f_info[0xe].shopnum - 1);
  _x = fff;
  o_name._72_8_ = mem_zalloc((ulong)z_info->store_inven_max << 3);
  _Var2 = have_valid_char_sheet_config();
  if (!_Var2) {
    configure_char_sheet();
  }
  buf._4_4_ = 0x50;
  if (0x50 < cached_config->res_cols * 2 + 1) {
    buf._4_4_ = cached_config->res_cols * 2 + 1;
  }
  wVar5 = text_wcsz();
  p_00 = (object *)mem_alloc((long)(wVar5 * buf._4_4_ + 1));
  file_putf(_x,"  [%s Character Dump]\n\n",buildid);
  display_player(L'\0');
  for (a = L'\x01'; a < L'\x17'; a = a + L'\x01') {
    obj = p_00;
    for (ylim = L'\0'; ylim < L'O'; ylim = ylim + L'\x01') {
      Term_what(ylim,a,(int *)((long)&home + 4),(wchar_t *)&home);
      wVar5 = text_wctomb((char *)obj,(wchar_t)home);
      if (wVar5 < L'\x01') {
        *(undefined1 *)&obj->kind = 0x20;
        obj = (object *)((long)&obj->kind + 1);
      }
      else {
        obj = (object *)(obj->flags + (long)wVar5 + -0x4c);
      }
    }
    while( true ) {
      bVar11 = false;
      if (p_00 < obj) {
        bVar11 = *(char *)((long)&obj[-1].note + 7) == ' ';
      }
      if (!bVar11) break;
      obj = (object *)((long)&obj[-1].note + 7);
    }
    *(undefined1 *)&obj->kind = 0;
    file_putf(_x,"%s\n",p_00);
  }
  display_player(L'\x01');
  file_putf(_x,"%-20s%s\n","Resistances","Abilities");
  if (cached_config->n_resist_by_region[1] < cached_config->n_resist_by_region[0]) {
    local_e8 = cached_config->n_resist_by_region[0];
  }
  else {
    local_e8 = cached_config->n_resist_by_region[1];
  }
  c = local_e8 + cached_config->res_regions[0].row + L'\x02';
  for (a = cached_config->res_regions[0].row + L'\x02'; a < c; a = a + L'\x01') {
    obj = p_00;
    for (ylim = L'\0'; ylim < cached_config->res_cols * 2 + L'\x01'; ylim = ylim + L'\x01') {
      Term_what(ylim,a,(int *)((long)&home + 4),(wchar_t *)&home);
      wVar5 = text_wctomb((char *)obj,(wchar_t)home);
      if (wVar5 < L'\x01') {
        *(undefined1 *)&obj->kind = 0x20;
        obj = (object *)((long)&obj->kind + 1);
      }
      else {
        obj = (object *)(obj->flags + (long)wVar5 + -0x4c);
      }
    }
    while( true ) {
      bVar11 = false;
      if (p_00 < obj) {
        bVar11 = *(char *)((long)&obj[-1].note + 7) == ' ';
      }
      if (!bVar11) break;
      obj = (object *)((long)&obj[-1].note + 7);
    }
    *(undefined1 *)&obj->kind = 0;
    file_putf(_x,"%s\n",p_00);
  }
  file_putf(_x,"\n");
  file_putf(_x,"%-20s%s\n","Hindrances","Modifiers");
  if (cached_config->n_resist_by_region[3] < cached_config->n_resist_by_region[2]) {
    local_f0 = cached_config->n_resist_by_region[2];
  }
  else {
    local_f0 = cached_config->n_resist_by_region[3];
  }
  c = local_f0 + cached_config->res_regions[0].row + L'\x02';
  for (a = cached_config->res_regions[0].row + L'\x02'; a < c; a = a + L'\x01') {
    obj = p_00;
    for (ylim = L'\0'; ylim < cached_config->res_cols * 2 + L'\x01'; ylim = ylim + L'\x01') {
      Term_what(ylim + cached_config->res_cols * 2 + L'\x02',a,(int *)((long)&home + 4),
                (wchar_t *)&home);
      wVar5 = text_wctomb((char *)obj,(wchar_t)home);
      if (wVar5 < L'\x01') {
        *(undefined1 *)&obj->kind = 0x20;
        obj = (object *)((long)&obj->kind + 1);
      }
      else {
        obj = (object *)(obj->flags + (long)wVar5 + -0x4c);
      }
    }
    while( true ) {
      bVar11 = false;
      if (p_00 < obj) {
        bVar11 = *(char *)((long)&obj[-1].note + 7) == ' ';
      }
      if (!bVar11) break;
      obj = (object *)((long)&obj[-1].note + 7);
    }
    *(undefined1 *)&obj->kind = 0;
    file_putf(_x,"%s\n",p_00);
  }
  file_putf(_x,"\n\n");
  if ((player->is_dead & 1U) != 0) {
    uVar4 = messages_num();
    y = (wchar_t)uVar4;
    if (0xf < (uint)y) {
      y = L'\x0f';
    }
    file_putf(_x,"  [Last Messages]\n\n");
    while (paVar1 = _x, wVar5 = y + L'\xffffffff', L'\0' < y) {
      y = wVar5;
      pcVar7 = message_str((uint16_t)wVar5);
      file_putf(paVar1,"> %s\n",pcVar7);
    }
    y = wVar5;
    iVar6 = strcmp(player->died_from,"Retiring");
    if (iVar6 == 0) {
      file_putf(_x,"\nRetired.\n\n");
    }
    else {
      file_putf(_x,"\nKilled by %s.\n\n",player->died_from);
    }
  }
  file_putf(_x,"  [Character Equipment]\n\n");
  for (y = L'\0'; y < (int)(uint)(player->body).count; y = y + L'\x01') {
    poVar8 = slot_object(player,y);
    if (poVar8 != (object *)0x0) {
      object_desc(local_88,0x50,poVar8,0x43,player);
      paVar1 = _x;
      cVar3 = gear_to_label(player,poVar8);
      file_putf(paVar1,"%c) %s\n",(ulong)(uint)(int)cVar3,local_88);
      object_info_chardump(_x,poVar8,L'\x05',L'H');
    }
  }
  file_putf(_x,"\n\n");
  file_putf(_x,"\n\n  [Character Inventory]\n\n");
  for (y = L'\0';
      (y < (int)(uint)z_info->pack_size &&
      (poVar8 = player->upkeep->inven[y], poVar8 != (object *)0x0)); y = y + L'\x01') {
    object_desc(local_88,0x50,poVar8,0x43,player);
    paVar1 = _x;
    cVar3 = gear_to_label(player,poVar8);
    file_putf(paVar1,"%c) %s\n",(ulong)(uint)(int)cVar3,local_88);
    object_info_chardump(_x,poVar8,L'\x05',L'H');
  }
  file_putf(_x,"\n\n");
  file_putf(_x,"\n\n  [Character Quiver]\n\n");
  for (y = L'\0'; y < (int)(uint)z_info->quiver_size; y = y + L'\x01') {
    poVar8 = player->upkeep->quiver[y];
    if (poVar8 != (object *)0x0) {
      object_desc(local_88,0x50,poVar8,0x43,player);
      paVar1 = _x;
      cVar3 = gear_to_label(player,poVar8);
      file_putf(paVar1,"%c) %s\n",(ulong)(uint)(int)cVar3,local_88);
      object_info_chardump(_x,poVar8,L'\x05',L'H');
    }
  }
  file_putf(_x,"\n\n");
  store_stock_list(store,(object **)o_name._72_8_,(uint)z_info->store_inven_max);
  if (store->stock_num != '\0') {
    file_putf(_x,"  [Home Inventory]\n\n");
    y = L'\0';
    while ((y < (int)(uint)z_info->store_inven_max &&
           (poVar8 = *(object **)(o_name._72_8_ + (long)y * 8), poVar8 != (object *)0x0))) {
      object_desc(local_88,0x50,poVar8,0x43,player);
      file_putf(_x,"%c) %s\n",(ulong)(uint)(y + L'a'),local_88);
      object_info_chardump(_x,poVar8,L'\x05',L'H');
      y = y + L'\x01';
    }
    file_putf(_x,"\n\n");
  }
  dump_history(_x);
  file_putf(_x,"\n\n");
  file_putf(_x,"  [Options]\n\n");
  y = L'\0';
  do {
    if (L'\x04' < y) {
      if (((player->opts).opt[0x1e] & 1U) != 0) {
        file_putf(_x,"  [Randart seed]\n\n");
        file_putf(_x,"%08lx\n\n",(ulong)seed_randart);
      }
      mem_free((void *)o_name._72_8_);
      mem_free(p_00);
      return;
    }
    if (y == L'\0') {
      desc = "User interface";
LAB_00249ab9:
      file_putf(_x,"  [%s]\n\n",desc);
      for (title._4_4_ = 0; title._4_4_ < 0x2d; title._4_4_ = title._4_4_ + 1) {
        wVar5 = option_type(title._4_4_);
        if (wVar5 == y) {
          pcVar7 = option_desc(title._4_4_);
          sVar9 = utf8_strlen(pcVar7);
          if (sVar9 < 0x2d) {
            file_putf(_x,"%s%*s",pcVar7,(ulong)(0x2d - (int)sVar9)," ");
          }
          else {
            file_putf(_x,"%s",pcVar7);
          }
          paVar1 = _x;
          pcVar7 = "no ";
          if (((player->opts).opt[title._4_4_] & 1U) != 0) {
            pcVar7 = "yes";
          }
          pcVar10 = option_name(title._4_4_);
          file_putf(paVar1,": %s (%s)\n",pcVar7,pcVar10);
        }
      }
      file_putf(_x,"\n");
    }
    else if (y == L'\x01') {
      desc = "Birth";
      goto LAB_00249ab9;
    }
    y = y + L'\x01';
  } while( true );
}

Assistant:

void write_character_dump(ang_file *fff)
{
	int i, x, y, ylim;

	int a;
	wchar_t c;

	struct store *home = &stores[f_info[FEAT_HOME].shopnum - 1];
	struct object **home_list = mem_zalloc(sizeof(struct object *) *
										   z_info->store_inven_max);
	char o_name[80];

	int n;
	char *buf, *p;

	if (!have_valid_char_sheet_config()) {
		configure_char_sheet();
	}

	n = 80;
	if (n < 2 * cached_config->res_cols + 1) {
		n = 2 * cached_config->res_cols + 1;
	}
	buf = mem_alloc(text_wcsz() * n + 1);

	/* Begin dump */
	file_putf(fff, "  [%s Character Dump]\n\n", buildid);

	/* Display player basics */
	display_player(0);

	/* Dump part of the screen */
	for (y = 1; y < 23; y++) {
		p = buf;
		/* Dump each row */
		for (x = 0; x < 79; x++) {
			/* Get the attr/char */
			(void)(Term_what(x, y, &a, &c));

			/* Dump it */
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}

		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) --p;

		/* Terminate */
		*p = '\0';

		/* End the row */
		file_putf(fff, "%s\n", buf);
	}

	/* Display player resistances etc */
	display_player(1);

	/* Print a header */
	file_putf(fff, "%-20s%s\n", "Resistances", "Abilities");

	/* Dump part of the screen */
	ylim = ((cached_config->n_resist_by_region[0] >
		cached_config->n_resist_by_region[1]) ?
		cached_config->n_resist_by_region[0] :
		cached_config->n_resist_by_region[1]) +
		cached_config->res_regions[0].row + 2;
	for (y = cached_config->res_regions[0].row + 2; y < ylim; y++) {
		p = buf;
		/* Dump each row */
		for (x = 0; x < 2 * cached_config->res_cols + 1; x++) {
			/* Get the attr/char */
			(void)(Term_what(x, y, &a, &c));

			/* Dump it */
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}

		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) --p;

		/* Terminate */
		*p = '\0';

		/* End the row */
		file_putf(fff, "%s\n", buf);
	}

	/* Skip a line */
	file_putf(fff, "\n");

	/* Print a header */
	file_putf(fff, "%-20s%s\n", "Hindrances", "Modifiers");

	/* Dump part of the screen */
	ylim = ((cached_config->n_resist_by_region[2] >
		cached_config->n_resist_by_region[3]) ?
		cached_config->n_resist_by_region[2] :
		cached_config->n_resist_by_region[3]) +
		cached_config->res_regions[0].row + 2;
	for (y = cached_config->res_regions[0].row + 2; y < ylim; y++) {
		p = buf;
		/* Dump each row */
		for (x = 0; x < 2 * cached_config->res_cols + 1; x++) {
			/* Get the attr/char */
			(void)(Term_what(x + 2 * cached_config->res_cols + 2, y, &a, &c));

			/* Dump it */
			n = text_wctomb(p, c);
			if (n > 0) {
				p += n;
			} else {
				*p++ = ' ';
			}
		}

		/* Back up over spaces */
		while ((p > buf) && (p[-1] == ' ')) --p;

		/* Terminate */
		*p = '\0';

		/* End the row */
		file_putf(fff, "%s\n", buf);
	}

	/* Skip some lines */
	file_putf(fff, "\n\n");


	/* If dead, dump last messages -- Prfnoff */
	if (player->is_dead) {
		i = messages_num();
		if (i > 15) i = 15;
		file_putf(fff, "  [Last Messages]\n\n");
		while (i-- > 0)
		{
			file_putf(fff, "> %s\n", message_str((int16_t)i));
		}
		if (streq(player->died_from, "Retiring")) {
			file_putf(fff, "\nRetired.\n\n");
		} else {
			file_putf(fff, "\nKilled by %s.\n\n",
				player->died_from);
		}
	}


	/* Dump the equipment */
	file_putf(fff, "  [Character Equipment]\n\n");
	for (i = 0; i < player->body.count; i++) {
		struct object *obj = slot_object(player, i);
		if (!obj) continue;

		object_desc(o_name, sizeof(o_name), obj,
			ODESC_PREFIX | ODESC_FULL, player);
		file_putf(fff, "%c) %s\n", gear_to_label(player, obj), o_name);
		object_info_chardump(fff, obj, 5, 72);
	}
	file_putf(fff, "\n\n");

	/* Dump the inventory */
	file_putf(fff, "\n\n  [Character Inventory]\n\n");
	for (i = 0; i < z_info->pack_size; i++) {
		struct object *obj = player->upkeep->inven[i];
		if (!obj) break;

		object_desc(o_name, sizeof(o_name), obj,
			ODESC_PREFIX | ODESC_FULL, player);
		file_putf(fff, "%c) %s\n", gear_to_label(player, obj), o_name);
		object_info_chardump(fff, obj, 5, 72);
	}
	file_putf(fff, "\n\n");

	/* Dump the quiver */
	file_putf(fff, "\n\n  [Character Quiver]\n\n");
	for (i = 0; i < z_info->quiver_size; i++) {
		struct object *obj = player->upkeep->quiver[i];
		if (!obj) continue;

		object_desc(o_name, sizeof(o_name), obj,
			ODESC_PREFIX | ODESC_FULL, player);
		file_putf(fff, "%c) %s\n", gear_to_label(player, obj), o_name);
		object_info_chardump(fff, obj, 5, 72);
	}
	file_putf(fff, "\n\n");

	/* Dump the Home -- if anything there */
	store_stock_list(home, home_list, z_info->store_inven_max);
	if (home->stock_num) {
		/* Header */
		file_putf(fff, "  [Home Inventory]\n\n");

		/* Dump all available items */
		for (i = 0; i < z_info->store_inven_max; i++) {
			struct object *obj = home_list[i];
			if (!obj) break;
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, player);
			file_putf(fff, "%c) %s\n", I2A(i), o_name);

			object_info_chardump(fff, obj, 5, 72);
		}

		/* Add an empty line */
		file_putf(fff, "\n\n");
	}

	/* Dump character history */
	dump_history(fff);
	file_putf(fff, "\n\n");

	/* Dump options */
	file_putf(fff, "  [Options]\n\n");

	/* Dump options */
	for (i = 0; i < OP_MAX; i++) {
		int opt;
		const char *title = "";
		switch (i) {
			case OP_INTERFACE: title = "User interface"; break;
			case OP_BIRTH: title = "Birth"; break;
		    default: continue;
		}

		file_putf(fff, "  [%s]\n\n", title);
		for (opt = 0; opt < OPT_MAX; opt++) {
			const char *desc;
			size_t u8len;

			if (option_type(opt) != i) continue;
			desc = option_desc(opt);
			u8len = utf8_strlen(desc);
			if (u8len < 45) {
				file_putf(fff, "%s%*s", desc,
					(int)(45 - u8len), " ");
			} else {
				file_putf(fff, "%s", desc);
			}
			file_putf(fff, ": %s (%s)\n",
			        player->opts.opt[opt] ? "yes" : "no ",
			        option_name(opt));
		}

		/* Skip some lines */
		file_putf(fff, "\n");
	}

	/*
	 * Display the randart seed, if applicable.  Use the same format as is
	 * used when constructing the randart file name.
	 */
	if (OPT(player, birth_randarts)) {
		file_putf(fff, "  [Randart seed]\n\n");
		file_putf(fff, "%08lx\n\n", (unsigned long)seed_randart);
	}

	mem_free(home_list);
	mem_free(buf);
}